

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  sqlite3_value *pVal;
  uint uVar2;
  uchar *puVar3;
  void *pvVar4;
  ulong uVar5;
  code *xDel;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long in_FS_OFFSET;
  double dVar10;
  double r2;
  char zBuf [50];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVal = *argv;
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
         [pVal->flags & 0x1f]) {
  case '\x01':
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      sqlite3_result_value(context,pVal);
      return;
    }
    goto LAB_001704ba;
  case '\x02':
    dVar10 = sqlite3VdbeRealValue(pVal);
    sqlite3_snprintf(0x32,zBuf,"%!.15g");
    sqlite3AtoF(zBuf,&r2,0x14,'\x01');
    if ((dVar10 != r2) || (NAN(dVar10) || NAN(r2))) {
      sqlite3_snprintf(0x32,zBuf,"%!.20e");
    }
    sqlite3_result_text(context,zBuf,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    break;
  case '\x03':
    puVar3 = sqlite3_value_text(pVal);
    if (puVar3 != (uchar *)0x0) {
      lVar9 = 3;
      lVar7 = 0;
      do {
        if (puVar3[lVar9 + -3] == '\'') {
          lVar7 = lVar7 + 1;
        }
        else if (puVar3[lVar9 + -3] == '\0') goto LAB_00170400;
        lVar9 = lVar9 + 1;
      } while( true );
    }
    break;
  case '\x04':
    pvVar4 = sqlite3_value_blob(pVal);
    uVar2 = sqlite3_value_bytes(*argv);
    pcVar8 = (char *)contextMalloc(context,(long)(int)uVar2 * 2 + 4);
    if (pcVar8 != (char *)0x0) {
      uVar5 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        pcVar8[uVar5 * 2 + 2] = "0123456789ABCDEF"[*(byte *)((long)pvVar4 + uVar5) >> 4];
        pcVar8[uVar5 * 2 + 3] = "0123456789ABCDEF"[*(byte *)((long)pvVar4 + uVar5) & 0xf];
      }
      (pcVar8 + (long)(int)uVar2 * 2 + 2)[0] = '\'';
      (pcVar8 + (long)(int)uVar2 * 2 + 2)[1] = '\0';
      pcVar8[0] = 'X';
      pcVar8[1] = '\'';
      sqlite3_result_text(context,pcVar8,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        sqlite3_free(pcVar8);
        return;
      }
      goto LAB_001704ba;
    }
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar8 = "NULL";
      uVar6 = 4;
      xDel = (_func_void_void_ptr *)0x0;
      goto LAB_001704a8;
    }
    goto LAB_001704ba;
  }
LAB_001703b6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_001704ba:
  __stack_chk_fail();
LAB_00170400:
  pcVar8 = (char *)contextMalloc(context,lVar7 + lVar9);
  if (pcVar8 != (char *)0x0) {
    *pcVar8 = '\'';
    uVar5 = 1;
    while( true ) {
      lVar9 = (long)(int)uVar5;
      uVar6 = lVar9 + 1;
      if (*puVar3 == '\0') break;
      pcVar8[lVar9] = *puVar3;
      if (*puVar3 == '\'') {
        pcVar8[uVar6] = '\'';
        uVar6 = (ulong)((int)uVar5 + 2);
      }
      puVar3 = puVar3 + 1;
      uVar5 = uVar6 & 0xffffffff;
    }
    pcVar8[lVar9] = '\'';
    pcVar8[uVar6] = '\0';
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      xDel = sqlite3_free;
LAB_001704a8:
      sqlite3_result_text(context,pcVar8,(int)uVar6,xDel);
      return;
    }
    goto LAB_001704ba;
  }
  goto LAB_001703b6;
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_FLOAT: {
      double r1, r2;
      char zBuf[50];
      r1 = sqlite3_value_double(argv[0]);
      sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.15g", r1);
      sqlite3AtoF(zBuf, &r2, 20, SQLITE_UTF8);
      if( r1!=r2 ){
        sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.20e", r1);
      }
      sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
      break;
    }
    case SQLITE_INTEGER: {
      sqlite3_result_value(context, argv[0]);
      break;
    }
    case SQLITE_BLOB: {
      char *zText = 0;
      char const *zBlob = sqlite3_value_blob(argv[0]);
      int nBlob = sqlite3_value_bytes(argv[0]);
      assert( zBlob==sqlite3_value_blob(argv[0]) ); /* No encoding change */
      zText = (char *)contextMalloc(context, (2*(i64)nBlob)+4); 
      if( zText ){
        int i;
        for(i=0; i<nBlob; i++){
          zText[(i*2)+2] = hexdigits[(zBlob[i]>>4)&0x0F];
          zText[(i*2)+3] = hexdigits[(zBlob[i])&0x0F];
        }
        zText[(nBlob*2)+2] = '\'';
        zText[(nBlob*2)+3] = '\0';
        zText[0] = 'X';
        zText[1] = '\'';
        sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
        sqlite3_free(zText);
      }
      break;
    }
    case SQLITE_TEXT: {
      int i,j;
      u64 n;
      const unsigned char *zArg = sqlite3_value_text(argv[0]);
      char *z;

      if( zArg==0 ) return;
      for(i=0, n=0; zArg[i]; i++){ if( zArg[i]=='\'' ) n++; }
      z = contextMalloc(context, ((i64)i)+((i64)n)+3);
      if( z ){
        z[0] = '\'';
        for(i=0, j=1; zArg[i]; i++){
          z[j++] = zArg[i];
          if( zArg[i]=='\'' ){
            z[j++] = '\'';
          }
        }
        z[j++] = '\'';
        z[j] = 0;
        sqlite3_result_text(context, z, j, sqlite3_free);
      }
      break;
    }
    default: {
      assert( sqlite3_value_type(argv[0])==SQLITE_NULL );
      sqlite3_result_text(context, "NULL", 4, SQLITE_STATIC);
      break;
    }
  }
}